

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O0

void Abc_NtkMiterPrint(Abc_Ntk_t *pNtk,char *pString,abctime clk,int fVerbose)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  uint local_2c;
  int fVerbose_local;
  abctime clk_local;
  char *pString_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fVerbose != 0) {
    uVar1 = Abc_NtkNodeNum(pNtk);
    iVar2 = Abc_NtkIsStrash(pNtk);
    if (iVar2 == 0) {
      local_2c = Abc_NtkLevel(pNtk);
    }
    else {
      local_2c = Abc_AigLevel(pNtk);
    }
    printf("Nodes = %7d.  Levels = %4d.  ",(ulong)uVar1,(ulong)local_2c);
    Abc_Print(1,"%s =",pString);
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - clk) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Abc_NtkMiterPrint( Abc_Ntk_t * pNtk, char * pString, abctime clk, int fVerbose )
{
    if ( !fVerbose )
        return;
    printf( "Nodes = %7d.  Levels = %4d.  ", Abc_NtkNodeNum(pNtk), 
        Abc_NtkIsStrash(pNtk)? Abc_AigLevel(pNtk) : Abc_NtkLevel(pNtk) );
    ABC_PRT( pString, Abc_Clock() - clk );
}